

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void prvTidyPPrintXMLTree(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  int iVar1;
  int iVar2;
  Node *pNVar3;
  Node *pNVar4;
  TidyParserMemory data;
  undefined1 auVar5 [32];
  bool bVar6;
  Bool BVar7;
  uint uVar8;
  Node *node_00;
  Node **ppNVar9;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint indent_00;
  uint local_90;
  uint local_84;
  TidyParserMemory memory;
  
  iVar1 = *(int *)((doc->config).value + 0x62);
  pNVar4 = node;
LAB_001468c0:
  do {
    node_00 = pNVar4;
    if (node_00 == (Node *)0x0) {
      return;
    }
    pNVar3 = node_00->next;
    if (doc->progressCallback != (TidyPPProgress)0x0) {
      uVar8 = (doc->pprint).line + 1;
      node = (Node *)(ulong)uVar8;
      (*doc->progressCallback)((TidyDoc)doc,node_00->line,node_00->column,uVar8);
    }
    switch(node_00->type) {
    case RootNode:
      goto switchD_00146904_caseD_0;
    case DocTypeTag:
      PPrintDocType(doc,indent,node_00);
      break;
    case CommentTag:
      PCondFlushLineSmart(doc,indent);
      PPrintComment(doc,indent,node_00);
      break;
    case ProcInsTag:
      PPrintPI(doc,indent,node_00);
      break;
    case TextNode:
      PPrintText(doc,mode,indent,node_00);
      node = node_00;
      break;
    default:
      BVar7 = prvTidynodeHasCM(node_00,1);
      if ((BVar7 == no) && ((node_00->type != StartEndTag || (iVar1 != 0)))) {
        if (node_00->type != RootNode) {
          iVar2 = *(int *)((doc->config).value + 0x26);
          ppNVar9 = &node_00->content;
          do {
            pNVar4 = *ppNVar9;
            if (pNVar4 == (Node *)0x0) break;
            BVar7 = prvTidynodeIsText(pNVar4);
            ppNVar9 = &pNVar4->next;
          } while (BVar7 == no);
          PCondFlushLineSmart(doc,indent);
          BVar7 = prvTidyXMLPreserveWhiteSpace(doc,node_00);
          if (BVar7 == no) {
            memory.register_2 = indent;
            if (pNVar4 == (Node *)0x0) {
              bVar6 = true;
              local_84 = 0;
              local_90 = iVar2 + indent;
            }
            else {
              bVar6 = false;
              local_84 = 1;
              local_90 = indent;
            }
          }
          else {
            bVar6 = true;
            local_84 = 0;
            local_90 = 0;
            memory.register_2 = 0;
          }
          node = node_00;
          PPrintTag(doc,mode,memory.register_2,node_00);
          if ((bVar6) && (node_00->content != (Node *)0x0)) {
            PFlushLineSmart(doc,local_90);
          }
          memory._32_8_ = (ulong)local_84 << 0x20;
          auVar5 = ZEXT1632(CONCAT88(pNVar3,node_00)) << 0x40;
          data.mode = memory.mode;
          data.register_1 = memory.register_1;
          data.identity = (Parser *)auVar5._0_8_;
          data.original_node = (Node *)auVar5._8_8_;
          data.reentry_node = (Node *)auVar5._16_8_;
          data.reentry_mode = auVar5._24_4_;
          data.reentry_state = auVar5._28_4_;
          data.register_2 = memory.register_2;
          data._44_4_ = 0;
          prvTidypushMemory(doc,data);
          indent = memory.register_2;
          if ((uint)memory.register_2 < (uint)(iVar2 * 0x32)) {
            indent = local_90;
          }
          pNVar4 = node_00->content;
          memory.original_node = node_00;
          memory.reentry_node = pNVar3;
          if (node_00->content != (Node *)0x0) goto LAB_001468c0;
        }
      }
      else {
        PCondFlushLineSmart(doc,indent);
        PPrintTag(doc,mode,indent,node_00);
        node = node_00;
      }
      break;
    case CDATATag:
      PPrintCDATA(doc,indent,node_00);
      break;
    case SectionTag:
      PPrintSection(doc,indent,node_00);
      break;
    case AspTag:
      PPrintAsp(doc,indent,node_00);
      break;
    case JsteTag:
      PPrintJste(doc,indent,node_00);
      break;
    case PhpTag:
      PPrintPhp(doc,indent,node_00);
      break;
    case XmlDecl:
      PPrintXmlDecl(doc,indent,node_00);
    }
    pNVar4 = pNVar3;
    if (pNVar3 == (Node *)0x0) {
      BVar7 = prvTidyisEmptyParserStack(doc);
      pNVar4 = (Node *)0x0;
      if (BVar7 == no) {
        do {
          prvTidypopMemory(doc);
          indent_00 = extraout_EDX;
          if ((memory.register_1 == 0) && ((memory.original_node)->content != (Node *)0x0)) {
            PCondFlushLineSmart(doc,memory.register_2);
            indent_00 = extraout_EDX_00;
          }
          PPrintEndTag(doc,(uint)memory.original_node,indent_00,node);
          pNVar4 = memory.reentry_node;
          indent = memory.register_2;
          if (memory.reentry_node != (Node *)0x0) goto LAB_001468c0;
          BVar7 = prvTidyisEmptyParserStack(doc);
        } while (BVar7 == no);
        pNVar4 = (Node *)0x0;
      }
    }
  } while( true );
switchD_00146904_caseD_0:
  pNVar4 = node_00->content;
  if (node_00->content == (Node *)0x0) {
    return;
  }
  goto LAB_001468c0;
}

Assistant:

void TY_(PPrintXMLTree)( TidyDocImpl* doc, uint mode, uint indent, Node *node )
{
    Bool xhtmlOut = cfgBool( doc, TidyXhtmlOut );
    Node* next = NULL;
    
    while ( node  )
    {
        next = node->next;
        
        if (doc->progressCallback)
        {
            doc->progressCallback( tidyImplToDoc(doc), node->line, node->column, doc->pprint.line + 1 );
        }
        
        if ( node->type == TextNode)
        {
            PPrintText( doc, mode, indent, node );
        }
        else if ( node->type == RootNode )
        {
            if (node->content) {
                node = node->content;
                continue;
            } else {
                break;
            }
        }
        else if ( node->type == CommentTag )
        {
            PCondFlushLineSmart( doc, indent );
            PPrintComment( doc, indent, node);
            /* PCondFlushLine( doc, 0 ); */
        }
        else if ( node->type == DocTypeTag )
            PPrintDocType( doc, indent, node );
        else if ( node->type == ProcInsTag )
            PPrintPI( doc, indent, node );
        else if ( node->type == XmlDecl )
            PPrintXmlDecl( doc, indent, node );
        else if ( node->type == CDATATag )
            PPrintCDATA( doc, indent, node );
        else if ( node->type == SectionTag )
            PPrintSection( doc, indent, node );
        else if ( node->type == AspTag )
            PPrintAsp( doc, indent, node );
        else if ( node->type == JsteTag)
            PPrintJste( doc, indent, node );
        else if ( node->type == PhpTag)
            PPrintPhp( doc, indent, node );
        else if ( TY_(nodeHasCM)(node, CM_EMPTY) ||
                  (node->type == StartEndTag && !xhtmlOut) )
        {
            PCondFlushLineSmart( doc, indent );
            PPrintTag( doc, mode, indent, node );
            /* TY_(PFlushLine)( doc, indent ); */
        }
        else if ( node->type != RootNode )  /* some kind of container element */
        {
            TidyParserMemory memory = {0};
            uint spaces = cfg( doc, TidyIndentSpaces );
            Node *content;
            Bool mixed = no;
            uint cindent;

            for ( content = node->content; content; content = content->next )
            {
                if ( TY_(nodeIsText)(content) )
                {
                    mixed = yes;
                    break;
                }
            }

            PCondFlushLineSmart( doc, indent );

            if ( TY_(XMLPreserveWhiteSpace)(doc, node) )
            {
                indent = 0;
                mixed = no;
                cindent = 0;
            }
            else if (mixed)
                cindent = indent;
            else
                cindent = indent + spaces;

            PPrintTag( doc, mode, indent, node );
            if ( !mixed && node->content )
                PFlushLineSmart( doc, cindent );
     
            memory.original_node = node;
            memory.reentry_node = next;
            memory.register_1 = mixed;
            memory.register_2 = indent;
            TY_(pushMemory)(doc, memory);

            /* Prevent infinite indentation. Seriously, at what point is
               anyone going to read a file with infinite indentation? It
               slows down rendering for arbitrarily-deep test cases that
               are only meant to crash Tidy in the first place. Let's
               consider whether to remove this limitation, lower it,
               increase it, or add a new configuration option to control
               it, or even emit an info-level message about it.
             */
            if (indent < TIDY_INDENTATION_LIMIT * spaces)
                indent = cindent;

            if (node->content)
            {
                node = node->content;
                continue;
            }
        }
        
        if (next)
        {
            node = next;
            continue;
        }
        
        if ( TY_(isEmptyParserStack)(doc) == no )
        {
            /* It's possible that the reentry_node is null, because we
               only pushed this record as a marker for the end tag while
               there was no next node. Thus the loop will pop until we have
               what we need. This also closes multiple end tags.
             */
            do {
                TidyParserMemory memory = TY_(popMemory)(doc);
                Node* close_node = memory.original_node;
                Bool mixed = memory.register_1;
                indent = memory.register_2;
                
                if ( !mixed && close_node->content )
                    PCondFlushLineSmart( doc, indent );

                PPrintEndTag( doc, mode, indent, close_node );
                /* PCondFlushLine( doc, indent ); */
           
                node = memory.reentry_node;
            } while ( node == NULL && TY_(isEmptyParserStack)(doc) == no );
            continue;;
        }
        node = NULL;
    } /* while */
}